

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O0

void __thiscall Uic::writeHeaderProtectionEnd(Uic *this)

{
  long lVar1;
  QTextStream *pQVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QString h;
  Data *local_28;
  char16_t *pcStack_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (Data *)0xaaaaaaaaaaaaaaaa;
  pcStack_20 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  Driver::headerFileName((Driver *)0xaaaaaaaaaaaaaaaa);
  pQVar2 = (QTextStream *)QTextStream::operator<<(*(QTextStream **)(in_RDI + 8),"#endif // ");
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&local_28);
  QTextStream::operator<<(pQVar2,"\n");
  QString::~QString((QString *)0x1eccbd);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Uic::writeHeaderProtectionEnd()
{
    QString h = drv->headerFileName();
    out << "#endif // " << h << "\n";
}